

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool string_loop(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  uint uVar1;
  gravity_object_t *closure_00;
  gravity_class_t *pgVar2;
  gravity_value_t gVar3;
  gravity_value_t value_00;
  gravity_value_t value_01;
  _Bool _Var4;
  gravity_fiber_t *pgVar5;
  nanotime_t nVar6;
  nanotime_t t2;
  gravity_value_t v_str;
  nanotime_t t1;
  gravity_int_t i;
  gravity_int_t n;
  char *str;
  gravity_string_t *string;
  gravity_value_t value;
  gravity_closure_t *closure;
  char local_2038 [8];
  char _buffer_1 [4096];
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if (nargs < 2) {
    snprintf(local_1028,0x1000,"Incorrect number of arguments.");
    pgVar5 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar5,local_1028);
    _buffer_1._4088_8_ = gravity_class_null;
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  else if (args[1].isa == gravity_class_closure) {
    closure_00 = args[1].field_1.p;
    gVar3 = *args;
    pgVar2 = ((args->field_1).p)->objclass;
    uVar1 = *(uint *)((long)&((args->field_1).p)->identifier + 4);
    t1 = 0;
    v_str.field_1.n = nanotime();
    for (; (long)t1 < (long)(ulong)uVar1; t1 = t1 + 1) {
      _t2 = gravity_string_to_value(vm,(char *)((long)&pgVar2->isa + t1),1);
      _Var4 = gravity_vm_runclosure
                        (vm,(gravity_closure_t *)closure_00,gVar3,(gravity_value_t *)&t2,1);
      if (!_Var4) {
        return false;
      }
    }
    nVar6 = nanotime();
    gVar3.field_1.p = (gravity_object_t *)(nVar6 - v_str.field_1.n);
    gVar3.isa = gravity_class_int;
    gravity_vm_setslot(vm,gVar3,_buffer._4088_4_);
    vm_local._7_1_ = true;
  }
  else {
    snprintf(local_2038,0x1000,"Argument must be a Closure.");
    pgVar5 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar5,local_2038);
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool string_loop (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_ERROR("Incorrect number of arguments.");
    if (!VALUE_ISA_CLOSURE(GET_VALUE(1))) RETURN_ERROR("Argument must be a Closure.");

    gravity_closure_t *closure = VALUE_AS_CLOSURE(GET_VALUE(1));    // closure to execute
    gravity_value_t value = GET_VALUE(0);                            // self parameter
    gravity_string_t *string = VALUE_AS_STRING(value);
    char *str = string->s;
    register gravity_int_t n = string->len;  // Times to execute the loop
    register gravity_int_t i = 0;

    nanotime_t t1 = nanotime();
    while (i < n) {
        gravity_value_t v_str = VALUE_FROM_STRING(vm, str + i, 1);
        if (!gravity_vm_runclosure(vm, closure, value, &v_str, 1)) return false;
        ++i;
    }
    nanotime_t t2 = nanotime();
    RETURN_VALUE(VALUE_FROM_INT(t2-t1), rindex);
}